

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O2

void aspa_table_update_in_place_cleanup(aspa_update_operation **operations,size_t count)

{
  undefined8 *puVar1;
  long lVar2;
  aspa_update_operation *ptr;
  void *ptr_00;
  long lVar3;
  long in_FS_OFFSET;
  bool bVar4;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((operations != (aspa_update_operation **)0x0) && (*operations != (aspa_update_operation *)0x0)
     ) {
    lVar3 = 0x28;
    while( true ) {
      ptr = *operations;
      bVar4 = count == 0;
      count = count - 1;
      if (bVar4) break;
      if ((*(char *)((long)&ptr->index + lVar3) == '\0') &&
         (*(char *)((long)ptr + lVar3 + -0x20) == '\0')) {
        ptr_00 = *(void **)((long)ptr + lVar3 + -8);
        if (ptr_00 != (void *)0x0) {
          lrtr_free(ptr_00);
        }
        puVar1 = (undefined8 *)((long)ptr + lVar3 + -0x10);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      lVar3 = lVar3 + 0x30;
    }
    lrtr_free(ptr);
    *operations = (aspa_update_operation *)0x0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void aspa_table_update_in_place_cleanup(struct aspa_update_operation **operations, size_t count)
{
	if (!operations || !*operations)
		return;

	// If count == 0, this won't be executed
	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *op = &(*operations)[i];

		// If it's a remove operation, we inserted a reference to the removed record's providers.
		// Release that provider array now and restore that 'remove'
		// operation back to its original state.
		if (!op->is_no_op && op->type == ASPA_REMOVE) {
			if (op->record.provider_asns)
				lrtr_free(op->record.provider_asns);

			op->record.provider_asns = NULL;
			op->record.provider_count = 0;
		}
	}

	lrtr_free(*operations);
	*operations = NULL;
}